

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# characterhash.h
# Opt level: O0

void __thiscall
CharacterHash<unsigned_int,_unsigned_char>::CharacterHash
          (CharacterHash<unsigned_int,_unsigned_char> *this,uint maxval)

{
  uint32_conflict uVar1;
  ulong local_13b8;
  size_t k;
  mersenneRNG randomgenerator;
  uint maxval_local;
  CharacterHash<unsigned_int,_unsigned_char> *this_local;
  
  randomgenerator._5012_4_ = maxval;
  mersenneRNG::mersenneRNG((mersenneRNG *)&k,maxval);
  for (local_13b8 = 0; local_13b8 < 0x100; local_13b8 = local_13b8 + 1) {
    uVar1 = mersenneRNG::operator()((mersenneRNG *)&k);
    this->hashvalues[local_13b8] = uVar1;
  }
  return;
}

Assistant:

CharacterHash(hashvaluetype maxval) {
    if (sizeof(hashvaluetype) <= 4) {
      mersenneRNG randomgenerator(maxval);
      for (size_t k = 0; k < nbrofchars; ++k)
        hashvalues[k] = static_cast<hashvaluetype>(randomgenerator());
    } else if (sizeof(hashvaluetype) == 8) {
      mersenneRNG randomgenerator(maxval >> 32);
      mersenneRNG randomgeneratorbase((maxval >> 32) == 0 ? maxval
                                                          : 0xFFFFFFFFU);
      for (size_t k = 0; k < nbrofchars; ++k)
        hashvalues[k] = static_cast<hashvaluetype>(randomgeneratorbase()) |
                        (static_cast<hashvaluetype>(randomgenerator()) << 32);
    } else
      throw runtime_error("unsupported hash value type");
  }